

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

optional<unsigned_int> *
tinyusdz::value::TryGetUnderlyingTypeId
          (optional<unsigned_int> *__return_storage_ptr__,string *tyname)

{
  uint uVar1;
  bool bVar2;
  const_iterator cVar3;
  uint uVar4;
  string s;
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
  utyidmap;
  allocator local_2a1;
  undefined1 local_2a0 [32];
  string local_280;
  string local_260;
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
  local_240;
  
  memcpy(&local_240,&PTR_anon_var_dwarf_2489e0_005a8b68,0x210);
  ::std::__cxx11::string::string((string *)local_2a0,(string *)tyname);
  ::std::__cxx11::string::string((string *)&local_280,"[]",(allocator *)&local_260);
  bVar2 = endsWith(tyname,&local_280);
  ::std::__cxx11::string::_M_dispose();
  uVar4 = 0;
  if (bVar2) {
    ::std::__cxx11::string::string((string *)&local_260,"[]",&local_2a1);
    removeSuffix(&local_280,(string *)local_2a0,&local_260);
    ::std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_280);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar4 = 0x100000;
  }
  cVar3 = mapbox::eternal::impl::
          map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
          ::find(&local_240,(key_type *)&local_280);
  if (cVar3.pos ==
      (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *)
      &stack0xffffffffffffffd0) {
    ::std::__cxx11::string::_M_dispose();
    TryGetTypeId((optional<unsigned_int> *)local_2a0,tyname);
    __return_storage_ptr__->has_value_ = (bool)local_2a0[0];
    if (local_2a0[0] == (string)0x1) {
      __return_storage_ptr__->contained = (storage_t<unsigned_int>)local_2a0._4_4_;
    }
  }
  else {
    uVar1 = ((cVar3.pos)->super_element<mapbox::eternal::string,_unsigned_int>).pair.second;
    __return_storage_ptr__->has_value_ = true;
    __return_storage_ptr__->contained = (storage_t<unsigned_int>)(uVar4 | uVar1);
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<uint32_t> TryGetUnderlyingTypeId(const std::string &tyname) {
  MAPBOX_ETERNAL_CONSTEXPR const auto utyidmap =
      mapbox::eternal::hash_map<mapbox::eternal::string, uint32_t>({
        {kPoint3h, TYPE_ID_HALF3},
        {kPoint3f, TYPE_ID_FLOAT3},
        {kPoint3d, TYPE_ID_DOUBLE3},
        {kNormal3h, TYPE_ID_HALF3},
        {kNormal3f, TYPE_ID_FLOAT3},
        {kNormal3d, TYPE_ID_DOUBLE3},
        {kVector3h, TYPE_ID_HALF3},
        {kVector3f, TYPE_ID_FLOAT3},
        {kVector3d, TYPE_ID_DOUBLE3},
        {kColor3h, TYPE_ID_HALF3},
        {kColor3f, TYPE_ID_FLOAT3},
        {kColor3d, TYPE_ID_DOUBLE3},
        {kColor4h, TYPE_ID_HALF4},
        {kColor4f, TYPE_ID_FLOAT4},
        {kColor4d, TYPE_ID_DOUBLE4},
        {kTexCoord2h, TYPE_ID_HALF2},
        {kTexCoord2f, TYPE_ID_FLOAT2},
        {kTexCoord2d, TYPE_ID_DOUBLE3},
        {kTexCoord3h, TYPE_ID_HALF3},
        {kTexCoord3f, TYPE_ID_FLOAT3},
        {kTexCoord3d, TYPE_ID_DOUBLE4},
        {kFrame4d, TYPE_ID_MATRIX4D},
  });

  {
    std::string s = tyname;
    uint32_t array_bit = 0;
    if (endsWith(tyname, "[]")) {
      s = removeSuffix(s, "[]");
      array_bit |= TYPE_ID_1D_ARRAY_BIT;
    }

    auto ret = utyidmap.find(s.c_str());
    if (ret != utyidmap.end()) {
      return ret->second | array_bit;
    }
  }

  // Fallback
  return TryGetTypeId(tyname);
}